

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O2

void __thiscall duckdb::SimpleBufferedData::UnblockSinks(SimpleBufferedData *this)

{
  mutex *__mutex;
  InterruptState *this_00;
  shared_ptr<duckdb::ClientContext,_true> cc;
  weak_ptr<duckdb::ClientContext,_true> local_28;
  
  weak_ptr<duckdb::ClientContext,_true>::lock(&local_28);
  if ((local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     ((this->buffered_count).super___atomic_base<unsigned_long>._M_i < this->buffer_size)) {
    __mutex = &(this->super_BufferedData).glock;
    ::std::mutex::lock(__mutex);
    while ((this_00 = (this->blocked_sinks).c.
                      super__Deque_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur,
           (this->blocked_sinks).c.
           super__Deque_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur != this_00 &&
           ((this->buffered_count).super___atomic_base<unsigned_long>._M_i < this->buffer_size))) {
      InterruptState::Callback(this_00);
      ::std::deque<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::pop_front
                (&(this->blocked_sinks).c);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void SimpleBufferedData::UnblockSinks() {
	auto cc = context.lock();
	if (!cc) {
		return;
	}
	(void)cc;

	if (buffered_count >= BufferSize()) {
		return;
	}
	// Reschedule enough blocked sinks to populate the buffer
	lock_guard<mutex> lock(glock);
	while (!blocked_sinks.empty()) {
		auto &blocked_sink = blocked_sinks.front();
		if (buffered_count >= BufferSize()) {
			// We have unblocked enough sinks already
			break;
		}
		blocked_sink.Callback();
		blocked_sinks.pop();
	}
}